

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O0

void uv_wtf8_to_utf16(char *source_ptr,uint16_t *w_target,size_t w_target_len)

{
  uint16_t uVar1;
  int32_t iVar2;
  uint16_t *puVar3;
  size_t sStack_20;
  int32_t code_point;
  size_t w_target_len_local;
  uint16_t *w_target_local;
  char *source_ptr_local;
  
  sStack_20 = w_target_len;
  w_target_len_local = (size_t)w_target;
  w_target_local = (uint16_t *)source_ptr;
  do {
    iVar2 = uv__wtf8_decode1((char **)&w_target_local);
    if (iVar2 < 0) {
      __assert_fail("code_point >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/../src/idna.c"
                    ,0x18b,"void uv_wtf8_to_utf16(const char *, uint16_t *, size_t)");
    }
    if (iVar2 < 0x10001) {
      *(ushort *)w_target_len_local = (ushort)iVar2;
      sStack_20 = sStack_20 - 1;
      w_target_len_local = w_target_len_local + 2;
    }
    else {
      if (0x10fffe < iVar2) {
        __assert_fail("code_point < 0x10FFFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/../src/idna.c"
                      ,0x18d,"void uv_wtf8_to_utf16(const char *, uint16_t *, size_t)");
      }
      *(short *)w_target_len_local = (short)(iVar2 + -0x10000 >> 10) + -0x2800;
      *(ushort *)(w_target_len_local + 2) = ((ushort)iVar2 & 0x3ff) + 0xdc00;
      sStack_20 = sStack_20 - 2;
      w_target_len_local = w_target_len_local + 4;
    }
    puVar3 = (uint16_t *)((long)w_target_local + 1);
    uVar1 = *w_target_local;
    w_target_local = puVar3;
  } while ((char)uVar1 != '\0');
  if (sStack_20 == 0) {
    return;
  }
  __assert_fail("w_target_len == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/../src/idna.c"
                ,0x198,"void uv_wtf8_to_utf16(const char *, uint16_t *, size_t)");
}

Assistant:

void uv_wtf8_to_utf16(const char* source_ptr,
                      uint16_t* w_target,
                      size_t w_target_len) {
  int32_t code_point;

  do {
    code_point = uv__wtf8_decode1(&source_ptr);
    /* uv_wtf8_length_as_utf16 should have been called and checked first. */
    assert(code_point >= 0);
    if (code_point > 0x10000) {
      assert(code_point < 0x10FFFF);
      *w_target++ = (((code_point - 0x10000) >> 10) + 0xD800);
      *w_target++ = ((code_point - 0x10000) & 0x3FF) + 0xDC00;
      w_target_len -= 2;
    } else {
      *w_target++ = code_point;
      w_target_len -= 1;
    }
  } while (*source_ptr++);

  (void)w_target_len;
  assert(w_target_len == 0);
}